

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DecimalUnaryOpBind<duckdb::AbsOperator>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  reference this_00;
  pointer pEVar1;
  reference pvVar2;
  LogicalType decimal_type;
  LogicalType local_70;
  _Any_data local_58;
  code *local_48;
  LogicalType local_38;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  LogicalType::LogicalType(&local_38,&pEVar1->return_type);
  if (local_38.physical_type_ == INT64) {
    LogicalType::LogicalType(&local_70,BIGINT);
    ScalarFunction::GetScalarUnaryFunction<duckdb::AbsOperator>
              ((scalar_function_t *)&local_58,&local_70);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(&bound_function->function,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  else if (local_38.physical_type_ == INT32) {
    LogicalType::LogicalType(&local_70,INTEGER);
    ScalarFunction::GetScalarUnaryFunction<duckdb::AbsOperator>
              ((scalar_function_t *)&local_58,&local_70);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(&bound_function->function,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  else if (local_38.physical_type_ == INT16) {
    LogicalType::LogicalType(&local_70,SMALLINT);
    ScalarFunction::GetScalarUnaryFunction<duckdb::AbsOperator>
              ((scalar_function_t *)&local_58,&local_70);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(&bound_function->function,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  else {
    LogicalType::LogicalType(&local_70,HUGEINT);
    ScalarFunction::GetScalarUnaryFunction<duckdb::AbsOperator>
              ((scalar_function_t *)&local_58,&local_70);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(&bound_function->function,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  LogicalType::~LogicalType(&local_70);
  pvVar2 = vector<duckdb::LogicalType,_true>::operator[]
                     (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
  if (pvVar2 != &local_38) {
    pvVar2->id_ = local_38.id_;
    pvVar2->physical_type_ = local_38.physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=(&pvVar2->type_info_,&local_38.type_info_);
  }
  if (&(bound_function->super_BaseScalarFunction).return_type != &local_38) {
    (bound_function->super_BaseScalarFunction).return_type.id_ = local_38.id_;
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ = local_38.physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
               &local_38.type_info_);
  }
  *(undefined8 *)this = 0;
  LogicalType::~LogicalType(&local_38);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> DecimalUnaryOpBind(ClientContext &context, ScalarFunction &bound_function,
                                            vector<unique_ptr<Expression>> &arguments) {
	auto decimal_type = arguments[0]->return_type;
	switch (decimal_type.InternalType()) {
	case PhysicalType::INT16:
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<OP>(LogicalTypeId::SMALLINT);
		break;
	case PhysicalType::INT32:
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<OP>(LogicalTypeId::INTEGER);
		break;
	case PhysicalType::INT64:
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<OP>(LogicalTypeId::BIGINT);
		break;
	default:
		bound_function.function = ScalarFunction::GetScalarUnaryFunction<OP>(LogicalTypeId::HUGEINT);
		break;
	}
	bound_function.arguments[0] = decimal_type;
	bound_function.return_type = decimal_type;
	return nullptr;
}